

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

bool __thiscall sortfun::operator()(sortfun *this,sortitem *xval,sortitem *yval)

{
  bool bVar1;
  sortitem *yval_local;
  sortitem *xval_local;
  sortfun *this_local;
  
  if ((this->x->field_2).minval != 6) {
    (this->x->field_2).minval = 6;
  }
  cleancode(this->x);
  this->x->field_4 = (anon_union_8_3_558327c1_for_ident_6)xval->str;
  if ((this->y->field_2).minval != 6) {
    (this->y->field_2).minval = 6;
  }
  cleancode(this->y);
  (this->y->field_4).val.field_0 = (anon_union_8_5_08252708_for_identval_0)yval->str;
  bVar1 = executebool(this->body);
  return bVar1;
}

Assistant:

bool operator()(const sortitem &xval, const sortitem &yval)
    {
        if(x->valtype != VAL_MACRO) x->valtype = VAL_MACRO;
        cleancode(*x);
        x->val.code = (const uint *)xval.str;
        if(y->valtype != VAL_MACRO) y->valtype = VAL_MACRO;
        cleancode(*y);
        y->val.code = (const uint *)yval.str;
        return executebool(body);
    }